

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

char * nifti_find_file_extension(char *name)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__src;
  uint uVar4;
  char extcopy [8];
  char extimg [8];
  char exthdr [8];
  char extnii [8];
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char extnia [8];
  
  local_58 = extnii;
  builtin_strncpy(extnii,".nii",5);
  extnii[5] = '\0';
  extnii[6] = '\0';
  extnii[7] = '\0';
  local_50 = exthdr;
  builtin_strncpy(exthdr,".hdr",5);
  exthdr[5] = '\0';
  exthdr[6] = '\0';
  exthdr[7] = '\0';
  local_48 = extimg;
  builtin_strncpy(extimg,".img",5);
  extimg[5] = '\0';
  extimg[6] = '\0';
  extimg[7] = '\0';
  local_40 = extnia;
  builtin_strncpy(extnia,".nia",5);
  extnia[5] = '\0';
  extnia[6] = '\0';
  extnia[7] = '\0';
  if (name != (char *)0x0) {
    sVar3 = strlen(name);
    uVar4 = (uint)sVar3;
    if (3 < (int)uVar4) {
      __src = name + ((ulong)(uVar4 & 0x7fffffff) - 4);
      strcpy(extcopy,__src);
      iVar2 = g_opts_2;
      if (g_opts_2 != 0) {
        make_lowercase(extcopy);
      }
      iVar1 = compare_strlist(extcopy,&local_58,4);
      if (iVar1 < 0) {
        if (uVar4 < 7) {
          return (char *)0x0;
        }
        __src = name + ((ulong)(uVar4 & 0x7fffffff) - 7);
        strcpy(extcopy,__src);
        if (iVar2 != 0) {
          make_lowercase(extcopy);
        }
        sVar3 = strlen(extnii);
        builtin_strncpy(extnii + sVar3,".gz",4);
        sVar3 = strlen(exthdr);
        builtin_strncpy(exthdr + sVar3,".gz",4);
        sVar3 = strlen(extimg);
        builtin_strncpy(extimg + sVar3,".gz",4);
        iVar2 = compare_strlist(extcopy,&local_58,3);
        if (iVar2 < 0) {
          if (g_opts_0 < 2) {
            return (char *)0x0;
          }
          fprintf(_stderr,"** find_file_ext: failed for name \'%s\'\n",name);
          return (char *)0x0;
        }
      }
      iVar2 = is_mixedcase(__src);
      if (iVar2 == 0) {
        return __src;
      }
      fprintf(_stderr,"** mixed case extension \'%s\' is not valid\n",__src);
    }
  }
  return (char *)0x0;
}

Assistant:

char * nifti_find_file_extension( const char * name )
{
   const char * ext;
   char extcopy[8];
   int    len;
   char   extnii[8] = ".nii";   /* modifiable, for possible uppercase */
   char   exthdr[8] = ".hdr";   /* (leave space for .gz) */
   char   extimg[8] = ".img";
   char   extnia[8] = ".nia";
   char   extgz[4]  = ".gz";
   char * elist[4]  = { NULL, NULL, NULL, NULL};

   /* stupid compiler... */
   elist[0] = extnii; elist[1] = exthdr; elist[2] = extimg; elist[3] = extnia;

   if ( ! name ) return NULL;

   len = (int)strlen(name);
   if ( len < 4 ) return NULL;

   ext = name + len - 4;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* if it look like a basic extension, fail or return it */
   if( compare_strlist(extcopy, elist, 4) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#ifdef HAVE_ZLIB
   if ( len < 7 ) return NULL;

   ext = name + len - 7;

   /* make manipulation copy, and possibly convert to lowercase */
   strcpy(extcopy, ext);
   if( g_opts.allow_upper_fext ) make_lowercase(extcopy);

   /* go after .gz extensions using the modifiable strings */
   strcat(elist[0], extgz); strcat(elist[1], extgz); strcat(elist[2], extgz);

   if( compare_strlist(extcopy, elist, 3) >= 0 ) {
      if( is_mixedcase(ext) ) {
         fprintf(stderr,"** mixed case extension '%s' is not valid\n", ext);
         return NULL;
      }
      else return (char *)ext; /* Cast away the constness of the input parameter */
   }

#endif

   if( g_opts.debug > 1 )
      fprintf(stderr,"** find_file_ext: failed for name '%s'\n", name);

   return NULL;
}